

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O0

bool __thiscall
cmCMakePresetsGraph::BuildPreset::VisitPresetInherit(BuildPreset *this,Preset *parentPreset)

{
  bool bVar1;
  BuildPreset *parent;
  BuildPreset *preset;
  Preset *parentPreset_local;
  BuildPreset *this_local;
  
  anon_unknown.dwarf_642c89::InheritString(&this->ConfigurePreset,(string *)(parentPreset + 1));
  anon_unknown.dwarf_642c89::InheritOptionalValue<bool>
            (&this->InheritConfigureEnvironment,
             (optional<bool> *)((long)&parentPreset[1].Name.field_2 + 8));
  anon_unknown.dwarf_642c89::InheritOptionalValue<int>
            (&this->Jobs,(optional<int> *)((long)&parentPreset[1].Name.field_2 + 0xc));
  (anonymous_namespace)::InheritVector<std::__cxx11::string>
            (&this->Targets,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&parentPreset[1].Inherits.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
  anon_unknown.dwarf_642c89::InheritString
            (&this->Configuration,(string *)&parentPreset[1].OriginFile);
  anon_unknown.dwarf_642c89::InheritOptionalValue<bool>
            (&this->CleanFirst,(optional<bool> *)((long)&parentPreset[1].DisplayName.field_2 + 8));
  anon_unknown.dwarf_642c89::InheritOptionalValue<bool>
            (&this->Verbose,(optional<bool> *)((long)&parentPreset[1].DisplayName.field_2 + 10));
  (anonymous_namespace)::InheritVector<std::__cxx11::string>
            (&this->NativeToolOptions,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&parentPreset[1].Description);
  bVar1 = std::optional::operator_cast_to_bool((optional *)&this->ResolvePackageReferences);
  if (!bVar1) {
    (this->ResolvePackageReferences).super__Optional_base<PackageResolveMode,_true,_true>._M_payload
    .super__Optional_payload_base<PackageResolveMode> =
         *(_Optional_payload_base<PackageResolveMode> *)
          ((long)&parentPreset[1].Description.field_2 + 8);
  }
  return true;
}

Assistant:

bool cmCMakePresetsGraph::BuildPreset::VisitPresetInherit(
  const cmCMakePresetsGraph::Preset& parentPreset)
{
  auto& preset = *this;
  const BuildPreset& parent = static_cast<const BuildPreset&>(parentPreset);

  InheritString(preset.ConfigurePreset, parent.ConfigurePreset);
  InheritOptionalValue(preset.InheritConfigureEnvironment,
                       parent.InheritConfigureEnvironment);
  InheritOptionalValue(preset.Jobs, parent.Jobs);
  InheritVector(preset.Targets, parent.Targets);
  InheritString(preset.Configuration, parent.Configuration);
  InheritOptionalValue(preset.CleanFirst, parent.CleanFirst);
  InheritOptionalValue(preset.Verbose, parent.Verbose);
  InheritVector(preset.NativeToolOptions, parent.NativeToolOptions);
  if (!preset.ResolvePackageReferences) {
    preset.ResolvePackageReferences = parent.ResolvePackageReferences;
  }

  return true;
}